

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdCelsiusSurfUnk2b8::is_valid_val(MthdCelsiusSurfUnk2b8 *this)

{
  uint uVar1;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  return uVar1 < 0xc && (~uVar1 & 3) != 0;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 4, 28))
			return false;
		if (extr(val, 0, 2) > 2)
			return false;
		if (extr(val, 2, 2) > 2)
			return false;
		return true;
	}